

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# percent_decode.c
# Opt level: O0

void percent_decode_bs(BinarySink *bs,ptrlen data)

{
  BinarySink *bs_00;
  ushort **ppuVar1;
  ulong uVar2;
  char local_34;
  char local_33;
  undefined1 local_32;
  uchar local_31;
  char hex [3];
  char *pcStack_30;
  char c;
  char *e;
  char *p;
  BinarySink *bs_local;
  ptrlen data_local;
  
  e = (char *)data.ptr;
  pcStack_30 = (char *)ptrlen_end(data);
  do {
    if (pcStack_30 <= e) {
      return;
    }
    local_31 = *e;
    if ((local_31 == '%') && (2 < (long)pcStack_30 - (long)e)) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)(byte)e[1]] & 0x1000) == 0) goto LAB_0015b4e8;
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)(byte)e[2]] & 0x1000) == 0) goto LAB_0015b4e8;
      local_34 = e[1];
      local_33 = e[2];
      local_32 = 0;
      bs_00 = bs->binarysink_;
      uVar2 = strtoul(&local_34,(char **)0x0,0x10);
      BinarySink_put_byte(bs_00,(uchar)uVar2);
      e = e + 2;
    }
    else {
LAB_0015b4e8:
      BinarySink_put_byte(bs->binarysink_,local_31);
    }
    e = e + 1;
  } while( true );
}

Assistant:

void percent_decode_bs(BinarySink *bs, ptrlen data)
{
    for (const char *p = data.ptr, *e = ptrlen_end(data); p < e; p++) {
        char c = *p;
        if (c == '%' && e-p >= 3 &&
            isxdigit((unsigned char)p[1]) &&
            isxdigit((unsigned char)p[2])) {
            char hex[3];
            hex[0] = p[1];
            hex[1] = p[2];
            hex[2] = '\0';
            put_byte(bs, strtoul(hex, NULL, 16));
            p += 2;
        } else {
            put_byte(bs, c);
        }
    }

}